

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pzgeom_utility.h
# Opt level: O0

int ProjectBissectionInParametricDomain<pzgeom::TPZQuadSphere<pzgeom::TPZGeoBlend<pzgeom::TPZGeoQuad>>>
              (TPZVec<double> *qsi,TPZVec<double> *qsiInDomain)

{
  double dVar1;
  double dVar2;
  double dVar3;
  bool bVar4;
  double *pdVar5;
  TPZVec<double> *in_RSI;
  int c_3;
  TPZTransform<double> T2;
  TPZTransform<double> T1;
  int is;
  TPZManVector<double,_3> pt2;
  TPZManVector<double,_3> pt1;
  int winnerSide;
  int c_2;
  int c_1;
  int c;
  REAL dist;
  TPZVec<double> InnPt;
  TPZVec<double> OutPt;
  REAL tol;
  int dim;
  int nsides;
  int64_t in_stack_fffffffffffffad8;
  _func_int **pp_Var6;
  TPZManVector<double,_3> *in_stack_fffffffffffffae0;
  TPZVec<double> *in_stack_fffffffffffffae8;
  TPZVec<double> *in_stack_fffffffffffffaf0;
  int64_t in_stack_fffffffffffffaf8;
  TPZManVector<double,_3> *in_stack_fffffffffffffb00;
  TPZVec<double> *in_stack_fffffffffffffb08;
  TPZTransform<double> *in_stack_fffffffffffffb10;
  int local_450;
  int local_44c;
  int in_stack_fffffffffffffce8;
  int in_stack_fffffffffffffcec;
  int local_104;
  TPZVec<double> local_100 [3];
  int local_90;
  int local_8c;
  int local_88;
  int local_84;
  double local_80;
  TPZVec<double> local_68;
  TPZVec<double> local_48;
  double local_28;
  undefined4 local_20;
  undefined4 local_1c;
  TPZVec<double> *local_18;
  int local_4;
  
  local_1c = 9;
  local_20 = 2;
  local_18 = in_RSI;
  (*in_RSI->_vptr_TPZVec[3])(in_RSI,2);
  bVar4 = pztopology::TPZQuadrilateral::IsInParametricDomain
                    (in_stack_fffffffffffffae8,(REAL)in_stack_fffffffffffffae0);
  if (bVar4) {
    TPZVec<double>::operator=(in_stack_fffffffffffffaf0,in_stack_fffffffffffffae8);
    local_4 = 8;
  }
  else {
    local_28 = 1e-10;
    TPZVec<double>::TPZVec(in_stack_fffffffffffffaf0,in_stack_fffffffffffffae8);
    TPZVec<double>::TPZVec
              (&in_stack_fffffffffffffae0->super_TPZVec<double>,in_stack_fffffffffffffad8);
    pztopology::TPZQuadrilateral::CenterPoint
              ((int)((ulong)in_stack_fffffffffffffaf0 >> 0x20),in_stack_fffffffffffffae8);
    local_80 = 0.0;
    for (local_84 = 0; local_84 < 2; local_84 = local_84 + 1) {
      pdVar5 = TPZVec<double>::operator[](&local_68,(long)local_84);
      dVar1 = *pdVar5;
      pdVar5 = TPZVec<double>::operator[](&local_48,(long)local_84);
      dVar2 = *pdVar5;
      pdVar5 = TPZVec<double>::operator[](&local_68,(long)local_84);
      dVar3 = *pdVar5;
      pdVar5 = TPZVec<double>::operator[](&local_48,(long)local_84);
      local_80 = (dVar1 - dVar2) * (dVar3 - *pdVar5) + local_80;
    }
    for (local_80 = sqrt(local_80); local_28 < local_80; local_80 = sqrt(local_80)) {
      for (local_88 = 0; local_88 < 2; local_88 = local_88 + 1) {
        pdVar5 = TPZVec<double>::operator[](&local_68,(long)local_88);
        dVar1 = *pdVar5;
        pdVar5 = TPZVec<double>::operator[](&local_48,(long)local_88);
        dVar2 = *pdVar5;
        pdVar5 = TPZVec<double>::operator[](local_18,(long)local_88);
        *pdVar5 = (dVar1 + dVar2) * 0.5;
      }
      bVar4 = pztopology::TPZQuadrilateral::IsInParametricDomain
                        (in_stack_fffffffffffffae8,(REAL)in_stack_fffffffffffffae0);
      if (bVar4) {
        TPZVec<double>::operator=(in_stack_fffffffffffffaf0,in_stack_fffffffffffffae8);
      }
      else {
        TPZVec<double>::operator=(in_stack_fffffffffffffaf0,in_stack_fffffffffffffae8);
      }
      local_80 = 0.0;
      for (local_8c = 0; local_8c < 2; local_8c = local_8c + 1) {
        pdVar5 = TPZVec<double>::operator[](&local_68,(long)local_8c);
        dVar1 = *pdVar5;
        pdVar5 = TPZVec<double>::operator[](&local_48,(long)local_8c);
        dVar2 = *pdVar5;
        pdVar5 = TPZVec<double>::operator[](&local_68,(long)local_8c);
        in_stack_fffffffffffffb10 = (TPZTransform<double> *)*pdVar5;
        pdVar5 = TPZVec<double>::operator[](&local_48,(long)local_8c);
        local_80 = (dVar1 - dVar2) * ((double)in_stack_fffffffffffffb10 - *pdVar5) + local_80;
      }
    }
    local_90 = -1;
    TPZManVector<double,_3>::TPZManVector(in_stack_fffffffffffffb00,in_stack_fffffffffffffaf8);
    TPZManVector<double,_3>::TPZManVector(in_stack_fffffffffffffb00,in_stack_fffffffffffffaf8);
    for (local_104 = 0; local_104 < 8; local_104 = local_104 + 1) {
      pztopology::TPZQuadrilateral::SideToSideTransform
                (in_stack_fffffffffffffcec,in_stack_fffffffffffffce8);
      TPZTransform<double>::Apply
                (in_stack_fffffffffffffb10,in_stack_fffffffffffffb08,
                 &in_stack_fffffffffffffb00->super_TPZVec<double>);
      pztopology::TPZQuadrilateral::SideToSideTransform
                (in_stack_fffffffffffffcec,in_stack_fffffffffffffce8);
      TPZTransform<double>::Apply
                (in_stack_fffffffffffffb10,in_stack_fffffffffffffb08,
                 &in_stack_fffffffffffffb00->super_TPZVec<double>);
      local_80 = 0.0;
      for (local_44c = 0; local_44c < 2; local_44c = local_44c + 1) {
        in_stack_fffffffffffffb08 =
             (TPZVec<double> *)TPZVec<double>::operator[](local_18,(long)local_44c);
        pp_Var6 = in_stack_fffffffffffffb08->_vptr_TPZVec;
        in_stack_fffffffffffffb00 =
             (TPZManVector<double,_3> *)TPZVec<double>::operator[](local_100,(long)local_44c);
        in_stack_fffffffffffffae8 =
             (TPZVec<double> *)
             ((double)pp_Var6 -
             (double)(in_stack_fffffffffffffb00->super_TPZVec<double>)._vptr_TPZVec);
        in_stack_fffffffffffffaf0 =
             (TPZVec<double> *)TPZVec<double>::operator[](local_18,(long)local_44c);
        pp_Var6 = in_stack_fffffffffffffaf0->_vptr_TPZVec;
        in_stack_fffffffffffffae0 =
             (TPZManVector<double,_3> *)TPZVec<double>::operator[](local_100,(long)local_44c);
        local_80 = (double)in_stack_fffffffffffffae8 *
                   ((double)pp_Var6 -
                   (double)(in_stack_fffffffffffffae0->super_TPZVec<double>)._vptr_TPZVec) +
                   local_80;
      }
      local_80 = sqrt(local_80);
      if (local_28 <= local_80) {
        local_450 = 0;
      }
      else {
        local_90 = local_104;
        TPZVec<double>::operator=(in_stack_fffffffffffffaf0,in_stack_fffffffffffffae8);
        local_450 = 0xd;
      }
      TPZTransform<double>::~TPZTransform((TPZTransform<double> *)0x17c4f8c);
      TPZTransform<double>::~TPZTransform((TPZTransform<double> *)0x17c4f99);
      if (local_450 != 0) break;
    }
    local_4 = local_90;
    TPZManVector<double,_3>::~TPZManVector(in_stack_fffffffffffffae0);
    TPZManVector<double,_3>::~TPZManVector(in_stack_fffffffffffffae0);
    TPZVec<double>::~TPZVec(&in_stack_fffffffffffffae0->super_TPZVec<double>);
    TPZVec<double>::~TPZVec(&in_stack_fffffffffffffae0->super_TPZVec<double>);
  }
  return local_4;
}

Assistant:

int ProjectBissectionInParametricDomain(TPZVec<REAL> &qsi, TPZVec<REAL> &qsiInDomain){
    const int nsides = Topology::NSides;
    const int dim = Topology::Dimension;
    
    qsiInDomain.Resize(dim);
    
    if(Topology::IsInParametricDomain(qsi,0.))///it is already in the domain
    {
        qsiInDomain = qsi;
        return nsides-1;
    }
    
    REAL tol = 1.e-10;
    
    ///first, will be made a project to center direction
    TPZVec<REAL> OutPt(qsi), InnPt(dim);
    Topology::CenterPoint(nsides-1,InnPt);
    
    REAL dist = 0.;
    for(int c = 0; c < dim; c++)
    {
        dist += (InnPt[c] - OutPt[c])*(InnPt[c] - OutPt[c]);
    }
    dist = sqrt(dist);
    
    while(dist > tol)
    {
        for(int c = 0; c < dim; c++)
        {
            qsiInDomain[c] = (InnPt[c] + OutPt[c])/2.;
        }
        if(Topology::IsInParametricDomain(qsiInDomain,0.))
        {
            InnPt = qsiInDomain;
        }
        else
        {
            OutPt = qsiInDomain;
        }
        dist = 0.;
        for(int c = 0; c < dim; c++)
        {
            dist += (InnPt[c] - OutPt[c])*(InnPt[c] - OutPt[c]);
        }
        dist = sqrt(dist);
    }
    
    ///found in witch side the projection belongs
    int winnerSide = -1;
    TPZManVector<REAL,3> pt1(dim), pt2(dim);
    for(int is = 0; is < nsides-1; is++)
    {
        ///Go orthogonally from \f$ NSides-1 \f$ to side is
        TPZTransform<> T1 = Topology::SideToSideTransform(nsides-1, is);
        T1.Apply(qsiInDomain,pt1);
        
        ///Come back from side is to \f$ NSides-1 \f$
        TPZTransform<> T2 = Topology::SideToSideTransform(is,nsides-1);
        T2.Apply(pt1,pt2);
        
        ///Compare ptInDomain to transformed point
        dist = 0.;
        for(int c = 0; c < dim; c++)
        {
            dist += (qsiInDomain[c]-pt2[c]) * (qsiInDomain[c]-pt2[c]);
        }//i
        dist = sqrt(dist);
        
        ///Closest side
        if(dist < tol)
        {
            winnerSide = is;
            qsiInDomain = pt2;
            break;
        }
    }//for is
    
    return winnerSide;
    
}